

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

bool __thiscall glcts::anon_unknown_0::VertexBindingState::stateVerify(VertexBindingState *this)

{
  long local_20;
  GLint64 p64;
  GLint p;
  bool status;
  VertexBindingState *this_local;
  
  p64._7_1_ = 1;
  _p = this;
  glu::CallLogWrapper::glGetIntegeri_v
            (&(this->super_GLWrapper).super_CallLogWrapper,0x8f4f,this->index,(GLint *)&p64);
  if ((uint)p64 != this->buffer) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_BUFFER(%d) is %d should be %d.\n",(ulong)(uint)this->index,
               (ulong)(uint)p64,(ulong)(uint)this->buffer);
    p64._7_1_ = 0;
  }
  glu::CallLogWrapper::glGetInteger64i_v
            (&(this->super_GLWrapper).super_CallLogWrapper,0x82d7,this->index,&local_20);
  if (local_20 != this->offset) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_OFFSET(%d) is %ld should be %ld.\n",(ulong)(uint)this->index,
               local_20,this->offset);
    p64._7_1_ = 0;
  }
  glu::CallLogWrapper::glGetIntegeri_v
            (&(this->super_GLWrapper).super_CallLogWrapper,0x82d8,this->index,(GLint *)&p64);
  if ((uint)p64 != this->stride) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_STRIDE(%d) is %d should be %d.\n",(ulong)(uint)this->index,
               (ulong)(uint)p64,(ulong)(uint)this->stride);
    p64._7_1_ = 0;
  }
  glu::CallLogWrapper::glGetIntegeri_v
            (&(this->super_GLWrapper).super_CallLogWrapper,0x82d6,this->index,(GLint *)&p64);
  if ((uint)p64 != this->divisor) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_DIVISOR(%d) is %d should be %d.\n",(ulong)(uint)this->index,
               (ulong)(uint)p64,(ulong)(uint)this->divisor);
    p64._7_1_ = 0;
  }
  return (bool)(p64._7_1_ & 1);
}

Assistant:

bool stateVerify()
	{
		bool  status = true;
		GLint p;
		glGetIntegeri_v(GL_VERTEX_BINDING_BUFFER, index, &p);
		if (p != buffer)
		{
			Output("GL_VERTEX_BINDING_BUFFER(%d) is %d should be %d.\n", index, p, buffer);
			status = false;
		}
		GLint64 p64;
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, index, &p64);
		if (p64 != offset)
		{
			Output("GL_VERTEX_BINDING_OFFSET(%d) is %ld should be %ld.\n", index, p64, offset);
			status = false;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, index, &p);
		if (p != stride)
		{
			Output("GL_VERTEX_BINDING_STRIDE(%d) is %d should be %d.\n", index, p, stride);
			status = false;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, index, &p);
		if (p != divisor)
		{
			Output("GL_VERTEX_BINDING_DIVISOR(%d) is %d should be %d.\n", index, p, divisor);
			status = false;
		}
		return status;
	}